

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.h
# Opt level: O2

Bipartition * __thiscall
Bipartition::operator~(Bipartition *__return_storage_ptr__,Bipartition *this)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  getPartition(&local_30,this);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
            (&local_50,&local_30);
  Bipartition(__return_storage_ptr__,&local_50);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_50);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline Bipartition operator~() const {
        return Bipartition(~(this->getPartition()));
    }